

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O2

void i2p_eddsa_keygen(i2p_eddsa *ed)

{
  byte local_f8 [31];
  byte local_d9;
  ge_p3 A;
  
  RAND_bytes(ed->key,0x20);
  SHA512(ed->key,0x20,local_f8);
  local_f8[0] = local_f8[0] & 0xf8;
  local_d9 = local_d9 & 0x3f | 0x40;
  crypto_sign_ed25519_ref10_ge_scalarmult_base(&A,local_f8);
  crypto_sign_ed25519_ref10_ge_p3_tobytes(ed->key + 0x20,&A);
  return;
}

Assistant:

void i2p_eddsa_keygen(struct i2p_eddsa * ed)
{
  uint8_t az[64];
  ge_p3 A;

  RAND_bytes(ed->key,32);
  SHA512(ed->key,32,az);
  az[0] &= 0xf8;
  az[31] &= 0x3f;
  az[31] |= 0x40;

  ge_scalarmult_base(&A,az);
  ge_p3_tobytes(ed->key + 32,&A);
}